

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecPool.c
# Opt level: O2

void Acec_ManProfile(Gia_Man_t *p,int fVerbose)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  abctime aVar4;
  Vec_Int_t *vAdds;
  abctime aVar5;
  Vec_Wec_t *p_00;
  Vec_Int_t *pVVar6;
  abctime time;
  char *pcVar7;
  abctime time_00;
  char *pStr;
  Vec_Int_t *vXors;
  
  aVar4 = Abc_Clock();
  vAdds = Ree_ManComputeCuts(p,&vXors,fVerbose);
  uVar2 = Ree_ManCountFadds(vAdds);
  iVar1 = vAdds->nSize;
  iVar3 = Ree_ManCountFadds(vAdds);
  pcVar7 = (char *)(ulong)uVar2;
  printf("Detected %d full-adders and %d half-adders.  Found %d XOR-cuts.  ",pcVar7,
         (ulong)(uint)(iVar1 / 6 - iVar3),(long)vXors->nSize / 4 & 0xffffffff);
  aVar5 = Abc_Clock();
  Abc_PrintTime((int)aVar5 - (int)aVar4,pcVar7,time);
  aVar4 = Abc_Clock();
  p_00 = Acec_ManCollectBoxSets(p,vAdds,vXors);
  iVar1 = p_00->nSize;
  pcVar7 = "";
  if (9 < iVar1) {
    pcVar7 = "s";
  }
  pStr = (char *)((long)iVar1 / 5 & 0xffffffff);
  printf("Detected %d adder-tree%s.  ",pStr,pcVar7);
  aVar5 = Abc_Clock();
  Abc_PrintTime((int)aVar5 - (int)aVar4,pStr,time_00);
  if (fVerbose != 0) {
    uVar2 = 0;
    for (iVar3 = 0; iVar3 < iVar1; iVar3 = iVar3 + 5) {
      printf("Tree %3d : ",(ulong)uVar2);
      pVVar6 = Vec_WecEntry(p_00,iVar3);
      printf("Xor = %4d  ",(ulong)(uint)pVVar6->nSize);
      pVVar6 = Vec_WecEntry(p_00,iVar3 + 1);
      printf("Root = %4d  ",(ulong)(uint)pVVar6->nSize);
      pVVar6 = Vec_WecEntry(p_00,iVar3 + 2);
      printf("Adder = %4d  ",(ulong)(uint)pVVar6->nSize);
      pVVar6 = Vec_WecEntry(p_00,iVar3 + 3);
      printf("In = %4d  ",(long)pVVar6->nSize / 2 & 0xffffffff,(long)pVVar6->nSize % 2 & 0xffffffff)
      ;
      pVVar6 = Vec_WecEntry(p_00,iVar3 + 4);
      printf("Out = %4d  ",(long)pVVar6->nSize / 2 & 0xffffffff,(long)pVVar6->nSize % 2 & 0xffffffff
            );
      putchar(10);
      printf("           Ins:  ");
      pVVar6 = Vec_WecEntry(p_00,iVar3 + 3);
      Acec_ManPrintRanks(pVVar6);
      printf("           Outs: ");
      pVVar6 = Vec_WecEntry(p_00,iVar3 + 4);
      Acec_ManPrintRanks(pVVar6);
      uVar2 = uVar2 + 1;
    }
  }
  Vec_IntFree(vXors);
  Vec_IntFree(vAdds);
  Vec_WecFree(p_00);
  return;
}

Assistant:

void Acec_ManProfile( Gia_Man_t * p, int fVerbose )
{
    abctime clk = Abc_Clock();
    Vec_Wec_t * vBoxes; int i;
    Vec_Int_t * vXors, * vAdds = Ree_ManComputeCuts( p, &vXors, fVerbose );

    //Ree_ManPrintAdders( vAdds, 1 );
    printf( "Detected %d full-adders and %d half-adders.  Found %d XOR-cuts.  ", Ree_ManCountFadds(vAdds), Vec_IntSize(vAdds)/6-Ree_ManCountFadds(vAdds), Vec_IntSize(vXors)/4 );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );

    clk = Abc_Clock();
    vBoxes = Acec_ManCollectBoxSets( p, vAdds, vXors );
    printf( "Detected %d adder-tree%s.  ", Vec_WecSize(vBoxes)/5, Vec_WecSize(vBoxes)/5 > 1 ? "s":"" );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );

    if ( fVerbose )
    for ( i = 0; 5*i < Vec_WecSize(vBoxes); i++ )
    {
        printf( "Tree %3d : ",     i );
        printf( "Xor = %4d  ",     Vec_IntSize(Vec_WecEntry(vBoxes,5*i+0)) );
        printf( "Root = %4d  ",    Vec_IntSize(Vec_WecEntry(vBoxes,5*i+1)) );
        //printf( "(Top = %5d)  ",   Vec_IntEntryLast(Vec_WecEntry(vBoxes,5*i+1)) );
        printf( "Adder = %4d  ",   Vec_IntSize(Vec_WecEntry(vBoxes,5*i+2)) );
        printf( "In = %4d  ",      Vec_IntSize(Vec_WecEntry(vBoxes,5*i+3))/2 );
        printf( "Out = %4d  ",     Vec_IntSize(Vec_WecEntry(vBoxes,5*i+4))/2 );
        printf( "\n" );
        printf( "           Ins:  " );
        Acec_ManPrintRanks( Vec_WecEntry(vBoxes,5*i+3) );
        printf( "           Outs: " );
        Acec_ManPrintRanks( Vec_WecEntry(vBoxes,5*i+4) );
    }

    Vec_IntFree( vXors );
    Vec_IntFree( vAdds );
    Vec_WecFree( vBoxes );
}